

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O2

int main(int argc,char **argv)

{
  socklen_t __len;
  bool bVar1;
  ptls_key_exchange_algorithm_t **pppVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  FILE *pFVar9;
  EVP_PKEY *pEVar10;
  ptls_key_exchange_algorithm_t **pppVar11;
  FILE *pFVar12;
  size_t sVar13;
  ptls_esni_context_t **pppVar14;
  ptls_esni_context_t *esni;
  uint8_t *puVar15;
  int *piVar16;
  ptls_key_exchange_algorithm_t *ppVar17;
  size_t sVar18;
  char *pcVar19;
  ulong __n;
  char *pcVar20;
  ptls_key_exchange_context_t **ctx;
  char *pcVar21;
  long lVar22;
  uchar *__dest;
  byte *pbVar23;
  bool bVar24;
  ptls_iovec_t esni_keys;
  size_t sStack_10c40;
  char *pcStack_10c28;
  ptls_buffer_t decode_buf;
  ptls_handshake_properties_t hsprop;
  ptls_context_t pStack_10b68;
  ptls_base64_decode_state_t pStack_10aa0;
  sockaddr_storage sa;
  ns_msg msg;
  anon_struct_136_2_ecfa8f33 esni_key_exchanges;
  char esni_name [256];
  ptls_key_exchange_algorithm_t *key_exchanges [128];
  uint8_t answer [1024];
  ns_rr rr;
  
  bVar1 = false;
  OPENSSL_init_crypto(2);
  OPENSSL_init_crypto(0xc);
  ENGINE_load_builtin_engines();
  ENGINE_register_all_ciphers();
  ENGINE_register_all_digests();
  __res_init();
  memset(key_exchanges,0,0x400);
  memset(&pStack_10b68.certificates,0,0xa8);
  pStack_10b68.random_bytes = ptls_openssl_random_bytes;
  pStack_10b68.get_time = &ptls_get_time;
  pStack_10b68.cipher_suites = ptls_openssl_cipher_suites;
  hsprop.collect_extension = (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_uint16_t *)0x0
  ;
  hsprop.collected_extensions =
       (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_ptls_raw_extension_t_ptr *)0x0;
  hsprop.field_0._96_8_ = 0;
  hsprop.additional_extensions = (ptls_raw_extension_t *)0x0;
  hsprop.field_0.server.cookie.additional_data.base = (uint8_t *)0x0;
  hsprop.field_0.server.cookie.additional_data.len = 0;
  hsprop.field_0.server.selected_psk_binder.len = 0;
  hsprop.field_0.server.cookie.key = (void *)0x0;
  hsprop.field_0.client.esni_keys.base = (uint8_t *)0x0;
  hsprop.field_0.client.esni_keys.len = 0;
  hsprop.field_0.client.max_early_data_size = (size_t *)0x0;
  hsprop.field_0._40_8_ = 0;
  hsprop.field_0.client.session_ticket.base = (uint8_t *)0x0;
  hsprop.field_0.client.session_ticket.len = 0;
  hsprop.field_0.client.negotiated_protocols.list = (ptls_iovec_t *)0x0;
  hsprop.field_0.client.negotiated_protocols.count = 0;
  iVar8 = 0;
  bVar24 = false;
  uVar3._0_1_ = '\0';
  uVar3._1_1_ = '\0';
  uVar3._2_1_ = '\0';
  uVar3._3_1_ = '\0';
  pcStack_10c28 = (char *)0x0;
  pcVar21 = (char *)0x0;
  pStack_10b68.key_exchanges = key_exchanges;
LAB_00105c5f:
  uVar4 = uVar3;
  iVar5 = getopt(argc,argv,"46abC:c:i:k:nN:es:SE:K:l:vh");
  iVar7 = _optind;
  pcVar19 = _optarg;
  uVar3 = uVar4;
  switch(iVar5) {
  case 0x61:
    pStack_10b68._104_1_ = pStack_10b68._104_1_ | 8;
    goto LAB_00105c5f;
  case 0x62:
    pStack_10b68.decompress_certificate = &ptls_decompress_certificate;
    goto LAB_00105c5f;
  case 99:
    goto switchD_00105c8f_caseD_63;
  case 100:
  case 0x66:
  case 0x67:
  case 0x6a:
  case 0x6d:
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x72:
  case 0x74:
switchD_00105c8f_caseD_64:
    exit(1);
  case 0x65:
    bVar1 = true;
    goto LAB_00105c5f;
  case 0x68:
    usage(*argv);
    exit(0);
  case 0x69:
    pcVar21 = _optarg;
    goto LAB_00105c5f;
  case 0x6b:
    pFVar9 = fopen(_optarg,"rb");
    if (pFVar9 == (FILE *)0x0) goto LAB_00106699;
    pEVar10 = PEM_read_PrivateKey(pFVar9,(EVP_PKEY **)0x0,(undefined1 *)0x0,(void *)0x0);
    fclose(pFVar9);
    if (pEVar10 == (EVP_PKEY *)0x0) {
      pcVar21 = "failed to read private key from file:%s\n";
      break;
    }
    ptls_openssl_init_sign_certificate
              ((ptls_openssl_sign_certificate_t *)load_private_key_sc,(EVP_PKEY *)pEVar10);
    EVP_PKEY_free(pEVar10);
    pStack_10b68.sign_certificate = (ptls_sign_certificate_t *)load_private_key_sc;
    goto LAB_00105c5f;
  case 0x6c:
    setup_log_event_ls._8_8_ = fopen(_optarg,"at");
    if ((FILE *)setup_log_event_ls._8_8_ == (FILE *)0x0) {
LAB_00106699:
      pFVar9 = _stderr;
      piVar16 = __errno_location();
      pcVar21 = strerror(*piVar16);
      pcVar20 = "failed to open file:%s:%s\n";
      goto LAB_001066e1;
    }
    setup_log_event_ls._0_8_ = log_event_cb;
    pStack_10b68.log_event = (ptls_log_event_t *)setup_log_event_ls;
    goto LAB_00105c5f;
  case 0x6e:
    hsprop.field_0._40_8_ = hsprop.field_0._40_8_ | 0x100000000;
    goto LAB_00105c5f;
  case 0x73:
    strcpy(setup_session_file_st + 8,_optarg);
    setup_session_file_st._0_8_ = util_save_ticket_cb;
    pStack_10b68.save_ticket = (ptls_save_ticket_t *)setup_session_file_st;
    pFVar9 = fopen(pcVar19,"rb");
    if (pFVar9 == (FILE *)0x0) goto LAB_00105c5f;
    sVar13 = fread(setup_session_file_ticket,1,0x4000,pFVar9);
    if ((sVar13 != 0) && (iVar7 = feof(pFVar9), iVar7 != 0)) {
      fclose(pFVar9);
      hsprop.field_0.client.session_ticket.base = setup_session_file_ticket;
      hsprop.field_0.client.session_ticket.len = sVar13;
      goto LAB_00105c5f;
    }
    pcVar21 = "failed to load ticket from file:%s\n";
    break;
  case 0x75:
    iVar8 = 1;
    goto LAB_00105c5f;
  case 0x76:
    ptls_openssl_init_verify_certificate
              ((ptls_openssl_verify_certificate_t *)setup_verify_certificate_vc,(X509_STORE *)0x0);
    pStack_10b68.verify_certificate = (ptls_verify_certificate_t *)setup_verify_certificate_vc;
    goto LAB_00105c5f;
  default:
    goto switchD_00105c8f_default;
  }
  goto LAB_00106723;
  while( true ) {
    memmove(__dest,pbVar23,__n);
    __dest = __dest + __n;
    pbVar23 = pbVar23 + __n;
    if (pbVar23 == rr.rdata + rr.rdlength) break;
LAB_001065dc:
    __n = (ulong)*pbVar23;
    pbVar23 = pbVar23 + 1;
    if ((ulong)((long)(rr.rdata + rr.rdlength) - (long)pbVar23) < __n) goto LAB_001063f1;
  }
  *__dest = '\0';
  ptls_base64_decode_init(&pStack_10aa0);
  iVar7 = ptls_base64_decode((char *)rr.rdata,&pStack_10aa0,&decode_buf);
  if (iVar7 == 0) {
    puVar15 = decode_buf.base;
    sVar18 = decode_buf.off;
    if (decode_buf.is_allocated == 0) {
      __assert_fail("decode_buf.is_allocated",
                    "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/util.h",
                    0x141,"ptls_iovec_t resolve_esni_keys(const char *)");
    }
  }
  else {
LAB_001063f1:
    ptls_buffer_dispose(&decode_buf);
    puVar15 = (uint8_t *)0x0;
    sVar18 = 0;
  }
  hsprop.field_0.client.esni_keys.base = puVar15;
  hsprop.field_0.client.esni_keys.len = sVar18;
  iVar7 = socket((uint)sa.ss_family,1,0);
  if (iVar7 == 1) {
LAB_00106549:
    pcVar21 = "socket(2) failed";
  }
  else {
    iVar5 = connect(iVar7,(sockaddr *)&sa,__len);
    if (iVar5 == 0) {
      iVar8 = handle_connection(iVar7,&pStack_10b68,pcVar19,pcVar21,&hsprop,iVar8);
      free(hsprop.field_0.client.esni_keys.base);
      return iVar8;
    }
    pcVar21 = "connect(2) failed";
  }
LAB_00106666:
  perror(pcVar21);
  return 1;
switchD_00105c8f_default:
  uVar3._0_1_ = '\x02';
  uVar3._1_1_ = '\0';
  uVar3._2_1_ = '\0';
  uVar3._3_1_ = '\0';
  if (iVar5 == 0x34) goto LAB_00105c5f;
  if (iVar5 == 0x36) {
    uVar3._0_1_ = '\n';
    uVar3._1_1_ = '\0';
    uVar3._2_1_ = '\0';
    uVar3._3_1_ = '\0';
    goto LAB_00105c5f;
  }
  if (iVar5 == 0x43) {
switchD_00105c8f_caseD_63:
    if (pStack_10b68.certificates.count == 0) {
      iVar7 = ptls_load_certificates(&pStack_10b68,_optarg);
      pFVar9 = _stderr;
      if (iVar7 == 0) {
        bVar24 = iVar5 == 99;
        uVar3 = uVar4;
        goto LAB_00105c5f;
      }
      piVar16 = __errno_location();
      pcVar21 = strerror(*piVar16);
      pcVar20 = "failed to load certificate:%s:%s\n";
      goto LAB_001066e1;
    }
    pcVar21 = "-C/-c can only be specified once\n";
LAB_0010657b:
    sStack_10c40 = 0x21;
LAB_0010657d:
    fwrite(pcVar21,sStack_10c40,1,_stderr);
  }
  else {
    if (iVar5 == 0x45) {
      pcStack_10c28 = _optarg;
      uVar3 = uVar4;
      goto LAB_00105c5f;
    }
    if (iVar5 == 0x4b) {
      pFVar12 = fopen(_optarg,"rt");
      pFVar9 = _stderr;
      pcVar19 = _optarg;
      if (pFVar12 == (FILE *)0x0) {
        piVar16 = __errno_location();
        pcVar21 = strerror(*piVar16);
        fprintf(pFVar9,"failed to open ESNI private key file:%s:%s\n",pcVar19,pcVar21);
        return 1;
      }
      pEVar10 = PEM_read_PrivateKey(pFVar12,(EVP_PKEY **)0x0,(undefined1 *)0x0,(void *)0x0);
      if (pEVar10 != (EVP_PKEY *)0x0) {
        ctx = esni_key_exchanges.elements + esni_key_exchanges.count;
        esni_key_exchanges.count = esni_key_exchanges.count + 1;
        uVar6 = ptls_openssl_create_key_exchange(ctx,(EVP_PKEY *)pEVar10);
        if (uVar6 != 0) {
          fprintf(_stderr,"failed to load private key from file:%s:picotls-error:%d",_optarg,
                  (ulong)uVar6);
          return 1;
        }
        EVP_PKEY_free(pEVar10);
        fclose(pFVar12);
        uVar3 = uVar4;
        goto LAB_00105c5f;
      }
      pcVar21 = "failed to load private key from file:%s\n";
      pcVar19 = _optarg;
    }
    else {
      if (iVar5 != 0x4e) {
        if (iVar5 == 0x53) {
          pStack_10b68._104_1_ = pStack_10b68._104_1_ | 1;
          uVar3 = uVar4;
          goto LAB_00105c5f;
        }
        if (iVar5 != -1) goto switchD_00105c8f_caseD_64;
        if ((pStack_10b68.sign_certificate != (ptls_sign_certificate_t *)0x0) ==
            (pStack_10b68.certificates.count == 0)) {
          pcVar21 = "-C/-c and -k options must be used together\n";
          sStack_10c40 = 0x2b;
        }
        else {
          lVar22 = (long)_optind;
          if (bVar24) {
            if (pStack_10b68.certificates.count == 0) {
              pcVar21 = "-c and -k options must be set\n";
              sStack_10c40 = 0x1e;
              goto LAB_0010657d;
            }
            if (pStack_10b68.decompress_certificate != (ptls_decompress_certificate_t *)0x0) {
              iVar5 = ptls_init_compressed_certificate
                                (&main::ecc,pStack_10b68.certificates.list,
                                 pStack_10b68.certificates.count,(ptls_iovec_t)ZEXT816(0));
              if (iVar5 != 0) {
                pcVar21 = "failed to create a brotli-compressed version of the certificate chain.\n"
                ;
                sStack_10c40 = 0x47;
                goto LAB_00106800;
              }
              pStack_10b68.emit_certificate = &main::ecc.super;
            }
            setup_session_cache_sc._0_8_ = encrypt_ticket_cb;
            pStack_10b68.ticket_lifetime = 0x15180;
            pStack_10b68.max_early_data_size = 0x2000;
            pStack_10b68.encrypt_ticket = (ptls_encrypt_ticket_t *)setup_session_cache_sc;
          }
          else if (bVar1) {
            hsprop.field_0.client.max_early_data_size = &main::max_early_data_size;
          }
          if (key_exchanges[0] == (ptls_key_exchange_algorithm_t *)0x0) {
            key_exchanges[0] = &ptls_openssl_secp256r1;
          }
          if (pcStack_10c28 != (char *)0x0) {
            if (esni_key_exchanges.count != 0) {
              pFVar12 = fopen(pcStack_10c28,"rb");
              pFVar9 = _stderr;
              pcVar19 = pcStack_10c28;
              if (pFVar12 == (FILE *)0x0) {
                piVar16 = __errno_location();
                pcVar21 = strerror(*piVar16);
                pcVar20 = "failed to open file:%s:%s\n";
LAB_001066e1:
                fprintf(pFVar9,pcVar20,pcVar19,pcVar21);
                goto switchD_00105c8f_caseD_64;
              }
              sVar13 = fread(&rr,1,0x10000,pFVar12);
              if ((sVar13 == 0) || (iVar5 = feof(pFVar12), iVar5 == 0)) {
                pcVar21 = "failed to load ESNI data from file:%s\n";
LAB_00106723:
                fprintf(_stderr,pcVar21,pcVar19);
                goto switchD_00105c8f_caseD_64;
              }
              fclose(pFVar12);
              pppVar14 = (ptls_esni_context_t **)malloc(0x10);
              pStack_10b68.esni = pppVar14;
              if (pppVar14 != (ptls_esni_context_t **)0x0) {
                esni = (ptls_esni_context_t *)malloc(0x28);
                *pppVar14 = esni;
                if (esni != (ptls_esni_context_t *)0x0) {
                  esni_keys.len = sVar13;
                  esni_keys.base = (uint8_t *)&rr;
                  uVar6 = ptls_esni_init_context
                                    (&pStack_10b68,esni,esni_keys,esni_key_exchanges.elements);
                  if (uVar6 != 0) {
                    fprintf(_stderr,"failed to parse ESNI data of file:%s:error=%d\n",pcStack_10c28,
                            (ulong)uVar6);
                    goto switchD_00105c8f_caseD_64;
                  }
                  goto LAB_001061f5;
                }
              }
              pcVar21 = "no memory\n";
              sStack_10c40 = 10;
LAB_00106800:
              fwrite(pcVar21,sStack_10c40,1,_stderr);
              goto switchD_00105c8f_caseD_64;
            }
            pcVar21 = "-E must be used together with -K\n";
            goto LAB_0010657b;
          }
LAB_001061f5:
          if (argc - iVar7 == 2) {
            pcVar19 = argv[lVar22];
            pcVar20 = argv[lVar22 + 1];
            rr.name[0x10] = '\0';
            rr.name[0x11] = '\0';
            rr.name[0x12] = '\0';
            rr.name[0x13] = '\0';
            rr.name[0x14] = '\0';
            rr.name[0x15] = '\0';
            rr.name[0x16] = '\0';
            rr.name[0x17] = '\0';
            rr.name[0x18] = '\0';
            rr.name[0x19] = '\0';
            rr.name[0x1a] = '\0';
            rr.name[0x1b] = '\0';
            rr.name[0x1c] = '\0';
            rr.name[0x1d] = '\0';
            rr.name[0x1e] = '\0';
            rr.name[0x1f] = '\0';
            rr.name[0x20] = '\0';
            rr.name[0x21] = '\0';
            rr.name[0x22] = '\0';
            rr.name[0x23] = '\0';
            rr.name[0x24] = '\0';
            rr.name[0x25] = '\0';
            rr.name[0x26] = '\0';
            rr.name[0x27] = '\0';
            rr.name[0x28] = '\0';
            rr.name[0x29] = '\0';
            rr.name[0x2a] = '\0';
            rr.name[0x2b] = '\0';
            rr.name[0x2c] = '\0';
            rr.name[0x2d] = '\0';
            rr.name[0x2e] = '\0';
            rr.name[0x2f] = '\0';
            rr.name[8] = '\x01';
            rr.name[9] = '\0';
            rr.name[10] = '\0';
            rr.name[0xb] = '\0';
            rr.name[0xc] = '\x06';
            rr.name[0xd] = '\0';
            rr.name[0xe] = '\0';
            rr.name[0xf] = '\0';
            rr.name[0] = '!';
            rr.name[1] = '\x04';
            rr.name[2] = '\0';
            rr.name[3] = '\0';
            rr.name._4_4_ = uVar4;
            iVar7 = getaddrinfo(pcVar19,pcVar20,(addrinfo *)&rr,(addrinfo **)answer);
            pFVar9 = _stderr;
            if ((iVar7 == 0) && (answer._0_8_ != 0)) {
              memcpy(&sa,*(void **)(answer._0_8_ + 0x18),(ulong)*(uint *)(answer._0_8_ + 0x10));
              __len = *(socklen_t *)(answer._0_8_ + 0x10);
              freeaddrinfo((addrinfo *)answer._0_8_);
              if (bVar24) {
                rr.name[0] = '\x01';
                rr.name[1] = '\0';
                rr.name[2] = '\0';
                rr.name[3] = '\0';
                iVar7 = socket((uint)sa.ss_family,1,0);
                if (iVar7 == -1) goto LAB_00106549;
                iVar5 = setsockopt(iVar7,1,2,&rr,4);
                if (iVar5 == 0) {
                  iVar5 = bind(iVar7,(sockaddr *)&sa,__len);
                  if (iVar5 == 0) {
                    iVar5 = listen(iVar7,0x1000);
                    if (iVar5 == 0) {
                      do {
                        do {
                          iVar5 = accept(iVar7,(sockaddr *)0x0,(socklen_t *)0x0);
                        } while (iVar5 == -1);
                        handle_connection(iVar5,&pStack_10b68,(char *)0x0,pcVar21,&hsprop,iVar8);
                      } while( true );
                    }
                    pcVar21 = "listen(2) failed";
                  }
                  else {
                    pcVar21 = "bind(2) failed";
                  }
                }
                else {
                  pcVar21 = "setsockopt(SO_REUSEADDR) failed";
                }
                goto LAB_00106666;
              }
              decode_buf.base = "";
              decode_buf.capacity = 0;
              decode_buf.off = 0;
              decode_buf.is_allocated = 0;
              uVar6 = snprintf(esni_name,0x100,"_esni.%s");
              if (((((0xff < uVar6) || (iVar7 = res_query(esni_name,1,0x10,answer,0x400), iVar7 < 1)
                    ) || (iVar7 = ns_initparse(answer,iVar7,(ns_msg *)&msg), iVar7 != 0)) ||
                  ((msg._counts[1] == 0 ||
                   (iVar7 = ns_parserr((ns_msg *)&msg,ns_s_an,0,(ns_rr *)&rr), iVar7 != 0)))) ||
                 ((ulong)rr.rdlength == 0)) goto LAB_001063f1;
              __dest = rr.rdata;
              pbVar23 = rr.rdata;
              goto LAB_001065dc;
            }
            if (iVar7 == 0) {
              pcVar21 = "getaddrinfo returned NULL";
            }
            else {
              pcVar21 = gai_strerror(iVar7);
            }
            fprintf(pFVar9,"failed to resolve address:%s:%s:%s\n",pcVar19,pcVar20,pcVar21);
            goto switchD_00105c8f_caseD_64;
          }
          pcVar21 = "missing host and port\n";
          sStack_10c40 = 0x16;
        }
        goto LAB_0010657d;
      }
      iVar7 = strcasecmp(_optarg,"secp256r1");
      ppVar17 = &ptls_openssl_secp256r1;
      if (iVar7 == 0) {
LAB_00105ffc:
        pppVar2 = key_exchanges;
        do {
          pppVar11 = pppVar2;
          pppVar2 = pppVar11 + 1;
        } while (*pppVar11 != (ptls_key_exchange_algorithm_t *)0x0);
        *pppVar11 = ppVar17;
        uVar3 = uVar4;
        goto LAB_00105c5f;
      }
      iVar7 = strcasecmp(pcVar19,"secp384r1");
      ppVar17 = &ptls_openssl_secp384r1;
      if (iVar7 == 0) goto LAB_00105ffc;
      iVar7 = strcasecmp(pcVar19,"secp521r1");
      ppVar17 = &ptls_openssl_secp521r1;
      if (iVar7 == 0) goto LAB_00105ffc;
      iVar7 = strcasecmp(pcVar19,"x25519");
      ppVar17 = &ptls_openssl_x25519;
      if (iVar7 == 0) goto LAB_00105ffc;
      pcVar21 = "could not find key exchange: %s\n";
    }
    fprintf(_stderr,pcVar21,pcVar19);
  }
  return 1;
}

Assistant:

int main(int argc, char **argv)
{
    ERR_load_crypto_strings();
    OpenSSL_add_all_algorithms();
#if !defined(OPENSSL_NO_ENGINE)
    /* Load all compiled-in ENGINEs */
    ENGINE_load_builtin_engines();
    ENGINE_register_all_ciphers();
    ENGINE_register_all_digests();
#endif

    res_init();

    ptls_key_exchange_algorithm_t *key_exchanges[128] = {NULL};
    ptls_context_t ctx = {ptls_openssl_random_bytes, &ptls_get_time, key_exchanges, ptls_openssl_cipher_suites};
    ptls_handshake_properties_t hsprop = {{{{NULL}}}};
    const char *host, *port, *file = NULL, *esni_file = NULL;
    struct {
        ptls_key_exchange_context_t *elements[16];
        size_t count;
    } esni_key_exchanges;
    int is_server = 0, use_early_data = 0, request_key_update = 0, ch;
    struct sockaddr_storage sa;
    socklen_t salen;
    int family = 0;

    while ((ch = getopt(argc, argv, "46abC:c:i:k:nN:es:SE:K:l:vh")) != -1) {
        switch (ch) {
        case '4':
            family = AF_INET;
            break;
        case '6':
            family = AF_INET6;
            break;
        case 'a':
            ctx.require_client_authentication = 1;
            break;
        case 'b':
#if PICOTLS_USE_BROTLI
            ctx.decompress_certificate = &ptls_decompress_certificate;
#else
            fprintf(stderr, "support for `-b` option was turned off during configuration\n");
            exit(1);
#endif
            break;
        case 'C':
        case 'c':
            if (ctx.certificates.count != 0) {
                fprintf(stderr, "-C/-c can only be specified once\n");
                return 1;
            }
            load_certificate_chain(&ctx, optarg);
            is_server = ch == 'c';
            break;
        case 'i':
            file = optarg;
            break;
        case 'k':
            load_private_key(&ctx, optarg);
            break;
        case 'n':
            hsprop.client.negotiate_before_key_exchange = 1;
            break;
        case 'e':
            use_early_data = 1;
            break;
        case 's':
            setup_session_file(&ctx, &hsprop, optarg);
            break;
        case 'S':
            ctx.require_dhe_on_psk = 1;
            break;
        case 'E':
            esni_file = optarg;
            break;
        case 'K': {
            FILE *fp;
            EVP_PKEY *pkey;
            int ret;
            if ((fp = fopen(optarg, "rt")) == NULL) {
                fprintf(stderr, "failed to open ESNI private key file:%s:%s\n", optarg, strerror(errno));
                return 1;
            }
            if ((pkey = PEM_read_PrivateKey(fp, NULL, NULL, NULL)) == NULL) {
                fprintf(stderr, "failed to load private key from file:%s\n", optarg);
                return 1;
            }
            if ((ret = ptls_openssl_create_key_exchange(esni_key_exchanges.elements + esni_key_exchanges.count++, pkey)) != 0) {
                fprintf(stderr, "failed to load private key from file:%s:picotls-error:%d", optarg, ret);
                return 1;
            }
            EVP_PKEY_free(pkey);
            fclose(fp);
        } break;
        case 'l':
            setup_log_event(&ctx, optarg);
            break;
        case 'v':
            setup_verify_certificate(&ctx);
            break;
        case 'N': {
            ptls_key_exchange_algorithm_t *algo = NULL;
#define MATCH(name)                                                                                                                \
    if (algo == NULL && strcasecmp(optarg, #name) == 0)                                                                            \
    algo = (&ptls_openssl_##name)
            MATCH(secp256r1);
#if PTLS_OPENSSL_HAVE_SECP384R1
            MATCH(secp384r1);
#endif
#if PTLS_OPENSSL_HAVE_SECP521R1
            MATCH(secp521r1);
#endif
#if PTLS_OPENSSL_HAVE_X25519
            MATCH(x25519);
#endif
#undef MATCH
            if (algo == NULL) {
                fprintf(stderr, "could not find key exchange: %s\n", optarg);
                return 1;
            }
            size_t i;
            for (i = 0; key_exchanges[i] != NULL; ++i)
                ;
            key_exchanges[i++] = algo;
        } break;
        case 'u':
            request_key_update = 1;
            break;
        case 'h':
            usage(argv[0]);
            exit(0);
        default:
            exit(1);
        }
    }
    argc -= optind;
    argv += optind;
    if ((ctx.certificates.count == 0) != (ctx.sign_certificate == NULL)) {
        fprintf(stderr, "-C/-c and -k options must be used together\n");
        return 1;
    }
    if (is_server) {
        if (ctx.certificates.count == 0) {
            fprintf(stderr, "-c and -k options must be set\n");
            return 1;
        }
#if PICOTLS_USE_BROTLI
        if (ctx.decompress_certificate != NULL) {
            static ptls_emit_compressed_certificate_t ecc;
            if (ptls_init_compressed_certificate(&ecc, ctx.certificates.list, ctx.certificates.count, ptls_iovec_init(NULL, 0)) !=
                0) {
                fprintf(stderr, "failed to create a brotli-compressed version of the certificate chain.\n");
                exit(1);
            }
            ctx.emit_certificate = &ecc.super;
        }
#endif
        setup_session_cache(&ctx);
    } else {
        /* client */
        if (use_early_data) {
            static size_t max_early_data_size;
            hsprop.client.max_early_data_size = &max_early_data_size;
        }
    }
    if (key_exchanges[0] == NULL)
        key_exchanges[0] = &ptls_openssl_secp256r1;
    if (esni_file != NULL) {
        if (esni_key_exchanges.count == 0) {
            fprintf(stderr, "-E must be used together with -K\n");
            return 1;
        }
        setup_esni(&ctx, esni_file, esni_key_exchanges.elements);
    }
    if (argc != 2) {
        fprintf(stderr, "missing host and port\n");
        return 1;
    }
    host = (--argc, *argv++);
    port = (--argc, *argv++);

    if (resolve_address((struct sockaddr *)&sa, &salen, host, port, family, SOCK_STREAM, IPPROTO_TCP) != 0)
        exit(1);

    if (is_server) {
        return run_server((struct sockaddr *)&sa, salen, &ctx, file, &hsprop, request_key_update);
    } else {
        return run_client((struct sockaddr *)&sa, salen, &ctx, host, file, &hsprop, request_key_update);
    }
}